

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall helics::CoreBroker::checkDependencies(CoreBroker *this)

{
  int iVar1;
  pointer ppVar2;
  BaseTimeCoordinator *pBVar3;
  long lVar4;
  long lVar5;
  GlobalFederateId *dep;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  _Var6;
  int *piVar7;
  GlobalFederateId GVar8;
  int iVar9;
  pointer __rhs;
  bool bVar10;
  string_view searchValue;
  string_view str;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> dependencies;
  size_type local_1c8;
  ActionMessage addDep;
  ActionMessage rmdep_1;
  
  if ((this->super_BrokerBase).field_0x294 == '\x01') {
    ppVar2 = (this->delayedDependencies).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__rhs = (this->delayedDependencies).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __rhs != ppVar2; __rhs = __rhs + 1) {
      searchValue._M_str = (__rhs->first)._M_dataplus._M_p;
      searchValue._M_len = (__rhs->first)._M_string_length;
      _Var6 = gmlc::containers::
              DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
              ::find(&this->mFederates,searchValue);
      if (_Var6._M_current ==
          (this->mFederates).dataStorage.
          super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        ActionMessage::ActionMessage
                  (&addDep,cmd_log,(GlobalFederateId)0x0,(GlobalFederateId)(__rhs->second).gid);
        addDep.messageID = 3;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &dependencies,"unable to locate ",&__rhs->first);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rmdep_1
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &dependencies," to establish dependency");
        SmallBuffer::operator=
                  (&addDep.payload,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rmdep_1);
        std::__cxx11::string::~string((string *)&rmdep_1);
        std::__cxx11::string::~string((string *)&dependencies);
        str._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        str._M_len = (this->super_BrokerBase).identifier._M_string_length;
        ActionMessage::setString(&addDep,0,str);
        routeMessage(this,&addDep);
      }
      else {
        ActionMessage::ActionMessage
                  (&addDep,cmd_add_dependency,(GlobalFederateId)(__rhs->second).gid,
                   (GlobalFederateId)((_Var6._M_current)->global_id).gid);
        routeMessage(this,&addDep);
        ActionMessage::ActionMessage
                  (&rmdep_1,cmd_add_dependent,(GlobalFederateId)((_Var6._M_current)->global_id).gid,
                   (GlobalFederateId)(__rhs->second).gid);
        ActionMessage::operator=(&addDep,&rmdep_1);
        ActionMessage::~ActionMessage(&rmdep_1);
        routeMessage(this,&addDep);
      }
      ActionMessage::~ActionMessage(&addDep);
    }
    BaseTimeCoordinator::getDependents
              ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
               &addDep,(this->super_BrokerBase).timeCoord._M_t.
                       super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                       .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
    lVar5 = CONCAT44(addDep.source_handle.hid,addDep.source_id.gid);
    lVar4 = CONCAT44(addDep.messageID,addDep.messageAction);
    std::_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
    ~_Vector_base((_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                   *)&addDep);
    if (lVar5 - lVar4 == 4) {
      BaseTimeCoordinator::getDependents
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 &addDep,(this->super_BrokerBase).timeCoord._M_t.
                         super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                         .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      GVar8.gid = *(BaseType *)CONCAT44(addDep.messageID,addDep.messageAction);
      std::_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
      ~_Vector_base((_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                     *)&addDep);
      BaseTimeCoordinator::getDependencies
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 &dependencies,
                 (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      if (local_1c8 - (long)_dependencies == 4) {
        if (*(uint *)_dependencies == GVar8.gid) {
          ActionMessage::ActionMessage(&addDep,cmd_remove_interdependency);
          addDep.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
          routeMessage(this,&addDep,GVar8);
          pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          (*pBVar3->_vptr_BaseTimeCoordinator[6])(pBVar3,(ulong)(uint)GVar8.gid);
          pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          (*pBVar3->_vptr_BaseTimeCoordinator[7])(pBVar3,(ulong)(uint)GVar8.gid);
        }
        else {
          ActionMessage::ActionMessage(&addDep,cmd_add_dependent);
          addDep.source_id.gid = GVar8.gid;
          ActionMessage::ActionMessage(&rmdep_1,cmd_remove_dependent);
          rmdep_1.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
          routeMessage(this,&addDep,(GlobalFederateId)*(BaseType *)_dependencies);
          routeMessage(this,&rmdep_1,(GlobalFederateId)*(BaseType *)_dependencies);
          ActionMessage::setAction(&addDep,cmd_add_dependency);
          addDep.source_id.gid = *(BaseType *)_dependencies;
          ActionMessage::setAction(&rmdep_1,cmd_remove_dependency);
          routeMessage(this,&addDep,GVar8);
          routeMessage(this,&rmdep_1,GVar8);
          pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          (*pBVar3->_vptr_BaseTimeCoordinator[6])(pBVar3,(ulong)*(uint *)_dependencies);
          pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          (*pBVar3->_vptr_BaseTimeCoordinator[7])(pBVar3,(ulong)(uint)GVar8.gid);
          ActionMessage::~ActionMessage(&rmdep_1);
        }
        ActionMessage::~ActionMessage(&addDep);
      }
      std::_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
      ~_Vector_base((_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                     *)&dependencies);
    }
  }
  else {
    BaseTimeCoordinator::getDependents
              ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
               &addDep,(this->super_BrokerBase).timeCoord._M_t.
                       super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                       .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
    lVar5 = CONCAT44(addDep.source_handle.hid,addDep.source_id.gid);
    lVar4 = CONCAT44(addDep.messageID,addDep.messageAction);
    std::_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
    ~_Vector_base((_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                   *)&addDep);
    if ((ulong)(lVar5 - lVar4) < 9) {
      BaseTimeCoordinator::getDependents
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 &addDep,(this->super_BrokerBase).timeCoord._M_t.
                         super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                         .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      iVar9 = 0;
      GVar8.gid = -2010000000;
      for (piVar7 = (int *)CONCAT44(addDep.messageID,addDep.messageAction);
          piVar7 != (int *)CONCAT44(addDep.source_handle.hid,addDep.source_id.gid);
          piVar7 = piVar7 + 1) {
        iVar1 = *piVar7;
        bVar10 = iVar1 != (this->super_BrokerBase).higher_broker_id.gid;
        if (bVar10) {
          GVar8.gid = iVar1;
        }
        iVar9 = iVar9 + (uint)bVar10;
      }
      std::_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
      ~_Vector_base((_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                     *)&addDep);
      if (iVar9 == 1) {
        pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar3->_vptr_BaseTimeCoordinator[6])
                  (pBVar3,(ulong)(uint)(this->super_BrokerBase).higher_broker_id.gid);
        pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar3->_vptr_BaseTimeCoordinator[6])(pBVar3,(ulong)(uint)GVar8.gid);
        pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar3->_vptr_BaseTimeCoordinator[7])
                  (pBVar3,(ulong)(uint)(this->super_BrokerBase).higher_broker_id.gid);
        pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar3->_vptr_BaseTimeCoordinator[7])(pBVar3,(ulong)(uint)GVar8.gid);
        ActionMessage::ActionMessage(&addDep,cmd_remove_interdependency);
        addDep.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
        routeMessage(this,&addDep,(GlobalFederateId)(this->super_BrokerBase).higher_broker_id.gid);
        routeMessage(this,&addDep,GVar8);
        ActionMessage::ActionMessage(&rmdep_1,cmd_add_interdependency);
        rmdep_1.flags = rmdep_1.flags | 0x4000;
        rmdep_1.source_id.gid = GVar8.gid;
        routeMessage(this,&rmdep_1,(GlobalFederateId)(this->super_BrokerBase).higher_broker_id.gid);
        rmdep_1.source_id.gid = (this->super_BrokerBase).higher_broker_id.gid;
        rmdep_1.flags = rmdep_1.flags & 0x9fff | 0x2000;
        routeMessage(this,&rmdep_1,GVar8);
        ActionMessage::~ActionMessage(&rmdep_1);
        ActionMessage::~ActionMessage(&addDep);
      }
    }
  }
  return;
}

Assistant:

void CoreBroker::checkDependencies()
{
    if (isRootc) {
        for (const auto& newdep : delayedDependencies) {
            auto depfed = mFederates.find(newdep.first);
            if (depfed != mFederates.end()) {
                ActionMessage addDep(CMD_ADD_DEPENDENCY, newdep.second, depfed->global_id);
                routeMessage(addDep);
                addDep = ActionMessage(CMD_ADD_DEPENDENT, depfed->global_id, newdep.second);
                routeMessage(addDep);
            } else {
                ActionMessage logWarning(CMD_LOG, parent_broker_id, newdep.second);
                logWarning.messageID = WARNING;
                logWarning.payload =
                    "unable to locate " + newdep.first + " to establish dependency";
                logWarning.setString(0, getIdentifier());
                routeMessage(logWarning);
            }
        }

        if (timeCoord->getDependents().size() == 1) {  // if there is just one dependency remove it
            auto depid{timeCoord->getDependents()[0]};
            auto dependencies = timeCoord->getDependencies();
            if (dependencies.size() == 1) {
                if (dependencies.front() != depid) {
                    ActionMessage adddep(CMD_ADD_DEPENDENT);
                    adddep.source_id = depid;
                    ActionMessage rmdep(CMD_REMOVE_DEPENDENT);
                    rmdep.source_id = global_broker_id_local;
                    routeMessage(adddep, dependencies.front());
                    routeMessage(rmdep, dependencies.front());

                    adddep.setAction(CMD_ADD_DEPENDENCY);
                    adddep.source_id = dependencies.front();
                    rmdep.setAction(CMD_REMOVE_DEPENDENCY);
                    routeMessage(adddep, depid);
                    routeMessage(rmdep, depid);

                    timeCoord->removeDependency(dependencies.front());
                    timeCoord->removeDependent(depid);
                } else {
                    ActionMessage rmdep(CMD_REMOVE_INTERDEPENDENCY);
                    rmdep.source_id = global_broker_id_local;

                    routeMessage(rmdep, depid);
                    timeCoord->removeDependency(depid);
                    timeCoord->removeDependent(depid);
                }
            }
        }
    } else {
        // if there is more than 2 dependents(higher broker + 2 or more other objects then we
        // need to be a timeCoordinator
        if (timeCoord->getDependents().size() > 2) {
            return;
        }

        GlobalFederateId fedid;
        int localcnt = 0;
        for (const auto& dep : timeCoord->getDependents()) {
            if (dep != higher_broker_id) {
                ++localcnt;
                fedid = dep;
            }
        }
        if (localcnt != 1) {
            return;
        }
        // remove the core from the time dependency chain
        timeCoord->removeDependency(higher_broker_id);
        timeCoord->removeDependency(fedid);
        timeCoord->removeDependent(higher_broker_id);
        timeCoord->removeDependent(fedid);

        ActionMessage rmdep(CMD_REMOVE_INTERDEPENDENCY);

        rmdep.source_id = global_broker_id_local;
        routeMessage(rmdep, higher_broker_id);
        routeMessage(rmdep, fedid);

        ActionMessage adddep(CMD_ADD_INTERDEPENDENCY);
        adddep.source_id = fedid;
        setActionFlag(adddep, child_flag);
        routeMessage(adddep, higher_broker_id);
        adddep.source_id = higher_broker_id;
        clearActionFlag(adddep, child_flag);
        setActionFlag(adddep, parent_flag);
        routeMessage(adddep, fedid);
    }
}